

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ftps_open_network(char *filename,curlmembuf *buffer)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  float fVar6;
  int status;
  int origLen;
  int len;
  int iDirpath;
  float version;
  char *strptr;
  char *dirpath;
  char *hostname;
  char *password;
  char *username;
  char tmphost [100];
  char local_538 [8];
  char url [1200];
  char agentStr [100];
  curlmembuf *buffer_local;
  char *filename_local;
  
  password = (char *)0x0;
  hostname = (char *)0x0;
  dirpath = (char *)0x0;
  strptr = (char *)0x0;
  _iDirpath = (char *)0x0;
  len = 0;
  strcpy(local_538,"ftp://");
  sVar2 = strlen(filename);
  for (origLen = 0; (origLen < (int)sVar2 && (filename[origLen] != '/')); origLen = origLen + 1) {
  }
  if (origLen < 100) {
    strncpy((char *)&username,filename,(long)origLen);
    strptr = filename + origLen;
    tmphost[(long)origLen + -8] = '\0';
    pcVar3 = strrchr((char *)&username,0x40);
    if (pcVar3 == (char *)0x0) {
      dirpath = (char *)&username;
    }
    else {
      *pcVar3 = '\0';
      dirpath = pcVar3 + 1;
      hostname = strchr((char *)&username,0x3a);
      if (hostname != (char *)0x0) {
        *hostname = '\0';
        hostname = hostname + 1;
      }
      password = (char *)&username;
    }
    if ((password == (char *)0x0) || (sVar2 = strlen(password), sVar2 == 0)) {
      password = "anonymous";
    }
    if ((hostname == (char *)0x0) || (sVar2 = strlen(hostname), sVar2 == 0)) {
      fVar6 = ffvers((float *)&len);
      snprintf(url + 0x4a8,100,"User-Agent: FITSIO/HEASARC/%-8.4f",(double)fVar6);
      hostname = url + 0x4a8;
    }
    sVar2 = strlen(local_538);
    sVar4 = strlen(dirpath);
    sVar5 = strlen(strptr);
    if (sVar2 + sVar4 + sVar5 < 0x4ad) {
      strcat(local_538,dirpath);
      strcat(local_538,strptr);
      sVar2 = strlen(local_538);
      iVar1 = (int)sVar2;
      filename_local._4_4_ = ssl_get_with_curl(local_538,buffer,password,hostname);
      sVar2 = strlen(local_538);
      if (((int)sVar2 - iVar1 == 2) || ((int)sVar2 - iVar1 == 3)) {
        sVar2 = strlen(filename);
        if (sVar2 < 0x3fe) {
          _iDirpath = local_538 + iVar1;
          strcat(filename,_iDirpath);
        }
        else {
          ffpmsg("Filename is too long to append compression ext (ftps_open_network)");
          filename_local._4_4_ = 0x68;
        }
      }
    }
    else {
      ffpmsg("Full URL name is too long (ftps_open_network)");
      filename_local._4_4_ = 0x68;
    }
  }
  else {
    ffpmsg("Host name is too long in URL (ftps_open_network)");
    filename_local._4_4_ = 0x68;
  }
  return filename_local._4_4_;
}

Assistant:

int ftps_open_network(char *filename, curlmembuf* buffer)
{
  char agentStr[SHORTLEN];
  char url[MAXLEN];
  char tmphost[SHORTLEN]; /* work array for separating user/pass/host names */
  char *username=0;
  char *password=0;
  char *hostname=0;
  char *dirpath=0;
  char *strptr=0;
  float version=0.0;
  int iDirpath=0, len=0, origLen=0;
  int status=0; 
  
  strcpy(url,"ftp://");

  /* The filename may already contain a username and password, as indicated 
     by a '@' within the host part of the name (which we'll define as the substring
     before the first '/').  If not, we'll set a default username:password  */
  len = strlen(filename);
  for (iDirpath=0; iDirpath<len; ++iDirpath)
  {
     if (filename[iDirpath] == '/')
        break;
  }
  if (iDirpath > SHORTLEN-1)
  {
     ffpmsg("Host name is too long in URL (ftps_open_network)");
     return (FILE_NOT_OPENED);
  }
  strncpy(tmphost, filename, iDirpath);
  dirpath = &filename[iDirpath];
  tmphost[iDirpath]='\0';
  
  /* There could be more than one '@' since they can also exist in the
     username or password.  Find the right-most '@' and assume that it
     delimits the host name. */
  hostname = strrchr(tmphost, '@');
  if (hostname)
  {
     *hostname = '\0';
     ++hostname;
     /* Assume first occurrence of ':' is indicative of password delimiter. */
     password = strchr(tmphost, ':');
     if (password)
     {
        *password = '\0';
        ++password;
     }
     username = tmphost;
  }
  else
     hostname = tmphost;
  
  if (!username || strlen(username)==0)
     username = "anonymous";
  if (!password || strlen(password)==0)
  {
     snprintf(agentStr,SHORTLEN,"User-Agent: FITSIO/HEASARC/%-8.4f",ffvers(&version));
     password = agentStr;
  }
  
  /* url may eventually have .gz or .Z appended to it */
  if (strlen(url) + strlen(hostname) + strlen(dirpath) > MAXLEN-4)
  {
     ffpmsg("Full URL name is too long (ftps_open_network)");
     return (FILE_NOT_OPENED);
  }
  strcat(url, hostname);
  strcat(url, dirpath);
  
/*  printf("url = %s\n",url);
  printf("username = %s\n",username);
  printf("password = %s\n",password);
  printf("hostname = %s\n",hostname);
*/

  origLen = strlen(url);
  status = ssl_get_with_curl(url, buffer, username, password);
  /* If original url has .gz or .Z appended, do the same to the original filename.
     Note that url also differs from original filename at this point, since
     filename may have included username@password (which url would not). */
  len = strlen(url);
  if ((len-origLen) == 2 || (len-origLen) == 3)
  {
     if (strlen(filename) > FLEN_FILENAME - 4)
     {
        ffpmsg("Filename is too long to append compression ext (ftps_open_network)");
        /* buffer memory must be freed by calling routine */
        return (FILE_NOT_OPENED);
     }
     strptr = url + origLen;
     strcat(filename, strptr);
  }
  return status;
  
 }